

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O2

void cfd::CoinSelection::ConvertToUtxo
               (uint64_t block_height,BlockHash *block_hash,Txid *txid,uint32_t vout,
               Script *locking_script,string *output_descriptor,Amount *amount,void *binary_data,
               Utxo *utxo,Script *scriptsig_template)

{
  CfdException *this;
  allocator local_561;
  string *local_560;
  UtxoData utxo_data;
  
  local_560 = output_descriptor;
  if (utxo != (Utxo *)0x0) {
    memset(utxo,0,0xd8);
    UtxoData::UtxoData(&utxo_data);
    utxo_data.block_height = block_height;
    core::BlockHash::operator=(&utxo_data.block_hash,block_hash);
    core::Txid::operator=(&utxo_data.txid,txid);
    utxo_data.vout = vout;
    core::Script::operator=(&utxo_data.locking_script,locking_script);
    std::__cxx11::string::_M_assign((string *)&utxo_data.descriptor);
    utxo_data.amount.ignore_check_ = amount->ignore_check_;
    utxo_data.amount.amount_ = amount->amount_;
    utxo_data.address_type = kP2wpkhAddress;
    if (scriptsig_template != (Script *)0x0) {
      core::Script::operator=(&utxo_data.scriptsig_template,scriptsig_template);
    }
    utxo_data.binary_data = binary_data;
    UtxoUtil::ConvertToUtxo(&utxo_data,utxo,(UtxoData *)0x0);
    UtxoData::~UtxoData(&utxo_data);
    return;
  }
  utxo_data.block_height =
       (long)
       "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/cfd_utxo.cpp"
       + 0x62;
  utxo_data.block_hash._vptr_BlockHash._0_4_ = 0x3c9;
  utxo_data.block_hash.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_start = "ConvertToUtxo";
  core::logger::warn<>((CfdSourceLocation *)&utxo_data,"utxo is nullptr.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&utxo_data,"Failed to convert utxo. utxo is nullptr.",&local_561);
  core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&utxo_data);
  __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void CoinSelection::ConvertToUtxo(
    uint64_t block_height, const BlockHash& block_hash, const Txid& txid,
    uint32_t vout, const Script& locking_script,
    const std::string& output_descriptor, const Amount& amount,
    const void* binary_data, Utxo* utxo, const Script* scriptsig_template) {
  if (utxo == nullptr) {
    warn(CFD_LOG_SOURCE, "utxo is nullptr.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to convert utxo. utxo is nullptr.");
  }
  memset(utxo, 0, sizeof(*utxo));

  UtxoData utxo_data;
  utxo_data.block_height = block_height;
  utxo_data.block_hash = block_hash;
  utxo_data.txid = txid;
  utxo_data.vout = vout;
  utxo_data.locking_script = locking_script;
  utxo_data.descriptor = output_descriptor;
  utxo_data.amount = amount;
  utxo_data.address_type = AddressType::kP2wpkhAddress;  // initialize
  if (scriptsig_template != nullptr) {
    utxo_data.scriptsig_template = *scriptsig_template;
  }
  memcpy(&utxo_data.binary_data, &binary_data, sizeof(void*));
  UtxoUtil::ConvertToUtxo(utxo_data, utxo, nullptr);
}